

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

void prvTidystrrep(tmbstr buffer,ctmbstr str,ctmbstr rep)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char buf [1024];
  char acStack_438 [1032];
  
  __s = strstr(buffer,str);
  do {
    if (__s == (char *)0x0) {
      return;
    }
    sVar1 = strlen(acStack_438);
    memset(acStack_438,0,sVar1);
    if (__s == buffer) {
      strcpy(acStack_438,rep);
    }
    else {
      sVar1 = strlen(buffer);
      sVar2 = strlen(__s);
      strncpy(acStack_438,buffer,sVar1 - sVar2);
      strcat(acStack_438,rep);
    }
    sVar1 = strlen(str);
    strcat(acStack_438,__s + sVar1);
    sVar1 = strlen(buffer);
    memset(buffer,0,sVar1);
    strcpy(buffer,acStack_438);
    __s = strstr(buffer,str);
  } while (__s != (char *)0x0);
  return;
}

Assistant:

void TY_(strrep)(tmbstr buffer, ctmbstr str, ctmbstr rep)
{
    char *p = strstr(buffer, str);
    do
    {
        if(p)
        {
            char buf[1024];
            memset(buf,'\0',strlen(buf));

            if(buffer == p)
            {
                strcpy(buf,rep);
                strcat(buf,p+strlen(str));
            }
            else
            {
                strncpy(buf,buffer,strlen(buffer) - strlen(p));
                strcat(buf,rep);
                strcat(buf,p+strlen(str));
            }

            memset(buffer,'\0',strlen(buffer));
            strcpy(buffer,buf);
        }

    } while(p && (p = strstr(buffer, str)));
}